

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
MatchExpr<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>,_EqualsRange<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>_>_>
::streamReconstructedExpression
          (MatchExpr<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>,_EqualsRange<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>_>_>
           *this,ostream *os)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_> *value;
  string matcherAsString;
  char local_61;
  string local_60;
  type local_40;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            (&local_60,(MatcherUntypedBase *)&this->m_matcher);
  StringMaker<std::map<Point,double,PointCmp,std::allocator<std::pair<Point_const,double>>>,void>::
  convert<std::map<Point,double,PointCmp,std::allocator<std::pair<Point_const,double>>>>
            (&local_40,
             (StringMaker<std::map<Point,double,PointCmp,std::allocator<std::pair<Point_const,double>>>,void>
              *)this->m_arg,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_40._M_dataplus._M_p,local_40._M_string_length);
  local_61 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_61,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  _Var1._M_p = local_60._M_dataplus._M_p;
  if ((local_60._M_string_length == DAT_002946a0) &&
     ((local_60._M_string_length == 0 ||
      (iVar2 = bcmp(local_60._M_dataplus._M_p,Detail::unprintableString_abi_cxx11_,
                    local_60._M_string_length), iVar2 == 0)))) {
    Catch::operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,_Var1._M_p,local_60._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }